

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O2

int coda_bin_cursor_read_int8_partial_array(coda_cursor *cursor,long offset,long length,int8_t *dst)

{
  int iVar1;
  coda_type *pcVar2;
  code *read_basic_type_function;
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  if ((*(coda_type **)(pcVar2 + 1))->format == coda_format_ascii) {
    read_basic_type_function = coda_ascii_cursor_read_int8;
  }
  else {
    if ((*(coda_type **)(pcVar2 + 1))->format != coda_format_binary) {
      __assert_fail("type->base_type->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                    ,0x4a8,
                    "int coda_bin_cursor_read_int8_partial_array(const coda_cursor *, long, long, int8_t *)"
                   );
    }
    read_basic_type_function = coda_bin_cursor_read_int8;
  }
  iVar1 = read_partial_array(cursor,read_basic_type_function,offset,length,(uint8_t *)dst,1);
  return iVar1;
}

Assistant:

int coda_bin_cursor_read_int8_partial_array(const coda_cursor *cursor, long offset, long length, int8_t *dst)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->base_type->format == coda_format_binary)
    {
        return read_partial_array(cursor, (read_function)&coda_bin_cursor_read_int8, offset, length, (uint8_t *)dst,
                                  sizeof(int8_t));
    }
    assert(type->base_type->format == coda_format_ascii);
    return read_partial_array(cursor, (read_function)&coda_ascii_cursor_read_int8, offset, length, (uint8_t *)dst,
                              sizeof(int8_t));
}